

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hak.cpp
# Opt level: O1

int __thiscall libDAI::HAK::init(HAK *this,EVP_PKEY_CTX *ctx)

{
  pointer pdVar1;
  ulong *puVar2;
  pointer pTVar3;
  pointer pdVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  ulong uVar12;
  int iVar13;
  pointer pTVar14;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Exception *this_00;
  long lVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 in_XMM5 [16];
  string local_40;
  
  iVar13 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[0x11])();
  if ((char)iVar13 != '\0') {
    pTVar14 = (this->_Qa).
              super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pTVar3 = (this->_Qa).
             super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (pTVar14 != pTVar3) {
      auVar19 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      do {
        pdVar4 = (pTVar14->_p)._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        lVar17 = (long)(pTVar14->_p)._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)pdVar4;
        if (lVar17 != 0) {
          lVar17 = lVar17 >> 3;
          auVar25 = vcvtusi2sd_avx512f(in_XMM5,lVar17);
          auVar25._0_8_ = 1.0 / auVar25._0_8_;
          auVar25._8_8_ = 0;
          auVar20 = vpbroadcastq_avx512f();
          auVar21 = vbroadcastsd_avx512f(auVar25);
          uVar18 = 0;
          do {
            auVar22 = vpbroadcastq_avx512f();
            auVar22 = vporq_avx512f(auVar22,auVar19);
            uVar16 = vpcmpuq_avx512f(auVar22,auVar20,2);
            pdVar1 = pdVar4 + uVar18;
            bVar5 = (bool)((byte)uVar16 & 1);
            bVar6 = (bool)((byte)(uVar16 >> 1) & 1);
            bVar7 = (bool)((byte)(uVar16 >> 2) & 1);
            bVar8 = (bool)((byte)(uVar16 >> 3) & 1);
            bVar9 = (bool)((byte)(uVar16 >> 4) & 1);
            bVar10 = (bool)((byte)(uVar16 >> 5) & 1);
            bVar11 = (bool)((byte)(uVar16 >> 6) & 1);
            *pdVar1 = (double)((ulong)bVar5 * auVar21._0_8_ | (ulong)!bVar5 * (long)*pdVar1);
            pdVar1[1] = (double)((ulong)bVar6 * auVar21._8_8_ | (ulong)!bVar6 * (long)pdVar1[1]);
            pdVar1[2] = (double)((ulong)bVar7 * auVar21._16_8_ | (ulong)!bVar7 * (long)pdVar1[2]);
            pdVar1[3] = (double)((ulong)bVar8 * auVar21._24_8_ | (ulong)!bVar8 * (long)pdVar1[3]);
            pdVar1[4] = (double)((ulong)bVar9 * auVar21._32_8_ | (ulong)!bVar9 * (long)pdVar1[4]);
            pdVar1[5] = (double)((ulong)bVar10 * auVar21._40_8_ | (ulong)!bVar10 * (long)pdVar1[5]);
            pdVar1[6] = (double)((ulong)bVar11 * auVar21._48_8_ | (ulong)!bVar11 * (long)pdVar1[6]);
            pdVar1[7] = (double)((uVar16 >> 7) * auVar21._56_8_ |
                                (ulong)!SUB81(uVar16 >> 7,0) * (long)pdVar1[7]);
            uVar18 = uVar18 + 8;
          } while ((lVar17 + (ulong)(lVar17 == 0) + 7 & 0xfffffffffffffff8) != uVar18);
        }
        pTVar14 = pTVar14 + 1;
      } while (pTVar14 != pTVar3);
    }
    pTVar14 = (this->_Qb).
              super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pTVar3 = (this->_Qb).
             super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (pTVar14 != pTVar3) {
      auVar19 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      do {
        pdVar4 = (pTVar14->_p)._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        lVar17 = (long)(pTVar14->_p)._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)pdVar4;
        if (lVar17 != 0) {
          lVar17 = lVar17 >> 3;
          auVar25 = vcvtusi2sd_avx512f(in_XMM5,lVar17);
          auVar26._0_8_ = 1.0 / auVar25._0_8_;
          auVar26._8_8_ = 0;
          auVar20 = vpbroadcastq_avx512f();
          auVar21 = vbroadcastsd_avx512f(auVar26);
          uVar18 = 0;
          do {
            auVar22 = vpbroadcastq_avx512f();
            auVar22 = vporq_avx512f(auVar22,auVar19);
            uVar16 = vpcmpuq_avx512f(auVar22,auVar20,2);
            pdVar1 = pdVar4 + uVar18;
            bVar5 = (bool)((byte)uVar16 & 1);
            bVar6 = (bool)((byte)(uVar16 >> 1) & 1);
            bVar7 = (bool)((byte)(uVar16 >> 2) & 1);
            bVar8 = (bool)((byte)(uVar16 >> 3) & 1);
            bVar9 = (bool)((byte)(uVar16 >> 4) & 1);
            bVar10 = (bool)((byte)(uVar16 >> 5) & 1);
            bVar11 = (bool)((byte)(uVar16 >> 6) & 1);
            *pdVar1 = (double)((ulong)bVar5 * auVar21._0_8_ | (ulong)!bVar5 * (long)*pdVar1);
            pdVar1[1] = (double)((ulong)bVar6 * auVar21._8_8_ | (ulong)!bVar6 * (long)pdVar1[1]);
            pdVar1[2] = (double)((ulong)bVar7 * auVar21._16_8_ | (ulong)!bVar7 * (long)pdVar1[2]);
            pdVar1[3] = (double)((ulong)bVar8 * auVar21._24_8_ | (ulong)!bVar8 * (long)pdVar1[3]);
            pdVar1[4] = (double)((ulong)bVar9 * auVar21._32_8_ | (ulong)!bVar9 * (long)pdVar1[4]);
            pdVar1[5] = (double)((ulong)bVar10 * auVar21._40_8_ | (ulong)!bVar10 * (long)pdVar1[5]);
            pdVar1[6] = (double)((ulong)bVar11 * auVar21._48_8_ | (ulong)!bVar11 * (long)pdVar1[6]);
            pdVar1[7] = (double)((uVar16 >> 7) * auVar21._56_8_ |
                                (ulong)!SUB81(uVar16 >> 7,0) * (long)pdVar1[7]);
            uVar18 = uVar18 + 8;
          } while ((lVar17 + (ulong)(lVar17 == 0) + 7 & 0xfffffffffffffff8) != uVar18);
        }
        pTVar14 = pTVar14 + 1;
      } while (pTVar14 != pTVar3);
    }
    iVar13 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
    lVar17 = CONCAT44(extraout_var,iVar13);
    if (*(long *)(lVar17 + 0x118) != *(long *)(lVar17 + 0x110)) {
      uVar18 = 0;
      auVar19 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      do {
        pTVar14 = (this->_muab).
                  super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        lVar17 = *(long *)&pTVar14[uVar18]._p._p.super__Vector_base<double,_std::allocator<double>_>
        ;
        lVar15 = (long)pTVar14[uVar18]._p._p.super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_finish - lVar17;
        if (lVar15 != 0) {
          lVar15 = lVar15 >> 3;
          auVar25 = vcvtusi2sd_avx512f(in_XMM5,lVar15);
          auVar23._0_8_ = 1.0 / auVar25._0_8_;
          auVar23._8_8_ = 0;
          auVar20 = vpbroadcastq_avx512f();
          auVar21 = vbroadcastsd_avx512f(auVar23);
          uVar16 = 0;
          do {
            auVar22 = vpbroadcastq_avx512f();
            auVar22 = vporq_avx512f(auVar22,auVar19);
            uVar12 = vpcmpuq_avx512f(auVar22,auVar20,2);
            puVar2 = (ulong *)(lVar17 + uVar16 * 8);
            bVar5 = (bool)((byte)uVar12 & 1);
            bVar6 = (bool)((byte)(uVar12 >> 1) & 1);
            bVar7 = (bool)((byte)(uVar12 >> 2) & 1);
            bVar8 = (bool)((byte)(uVar12 >> 3) & 1);
            bVar9 = (bool)((byte)(uVar12 >> 4) & 1);
            bVar10 = (bool)((byte)(uVar12 >> 5) & 1);
            bVar11 = (bool)((byte)(uVar12 >> 6) & 1);
            *puVar2 = (ulong)bVar5 * auVar21._0_8_ | (ulong)!bVar5 * *puVar2;
            puVar2[1] = (ulong)bVar6 * auVar21._8_8_ | (ulong)!bVar6 * puVar2[1];
            puVar2[2] = (ulong)bVar7 * auVar21._16_8_ | (ulong)!bVar7 * puVar2[2];
            puVar2[3] = (ulong)bVar8 * auVar21._24_8_ | (ulong)!bVar8 * puVar2[3];
            puVar2[4] = (ulong)bVar9 * auVar21._32_8_ | (ulong)!bVar9 * puVar2[4];
            puVar2[5] = (ulong)bVar10 * auVar21._40_8_ | (ulong)!bVar10 * puVar2[5];
            puVar2[6] = (ulong)bVar11 * auVar21._48_8_ | (ulong)!bVar11 * puVar2[6];
            puVar2[7] = (uVar12 >> 7) * auVar21._56_8_ | (ulong)!SUB81(uVar12 >> 7,0) * puVar2[7];
            uVar16 = uVar16 + 8;
          } while ((lVar15 + (ulong)(lVar15 == 0) + 7 & 0xfffffffffffffff8) != uVar16);
        }
        pTVar14 = (this->_muba).
                  super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        lVar17 = *(long *)&pTVar14[uVar18]._p._p.super__Vector_base<double,_std::allocator<double>_>
        ;
        lVar15 = (long)pTVar14[uVar18]._p._p.super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_finish - lVar17;
        if (lVar15 != 0) {
          lVar15 = lVar15 >> 3;
          auVar25 = vcvtusi2sd_avx512f(in_XMM5,lVar15);
          auVar24._0_8_ = 1.0 / auVar25._0_8_;
          auVar24._8_8_ = 0;
          auVar20 = vpbroadcastq_avx512f();
          auVar21 = vbroadcastsd_avx512f(auVar24);
          uVar16 = 0;
          do {
            auVar22 = vpbroadcastq_avx512f();
            auVar22 = vporq_avx512f(auVar22,auVar19);
            uVar12 = vpcmpuq_avx512f(auVar22,auVar20,2);
            puVar2 = (ulong *)(lVar17 + uVar16 * 8);
            bVar5 = (bool)((byte)uVar12 & 1);
            bVar6 = (bool)((byte)(uVar12 >> 1) & 1);
            bVar7 = (bool)((byte)(uVar12 >> 2) & 1);
            bVar8 = (bool)((byte)(uVar12 >> 3) & 1);
            bVar9 = (bool)((byte)(uVar12 >> 4) & 1);
            bVar10 = (bool)((byte)(uVar12 >> 5) & 1);
            bVar11 = (bool)((byte)(uVar12 >> 6) & 1);
            *puVar2 = (ulong)bVar5 * auVar21._0_8_ | (ulong)!bVar5 * *puVar2;
            puVar2[1] = (ulong)bVar6 * auVar21._8_8_ | (ulong)!bVar6 * puVar2[1];
            puVar2[2] = (ulong)bVar7 * auVar21._16_8_ | (ulong)!bVar7 * puVar2[2];
            puVar2[3] = (ulong)bVar8 * auVar21._24_8_ | (ulong)!bVar8 * puVar2[3];
            puVar2[4] = (ulong)bVar9 * auVar21._32_8_ | (ulong)!bVar9 * puVar2[4];
            puVar2[5] = (ulong)bVar10 * auVar21._40_8_ | (ulong)!bVar10 * puVar2[5];
            puVar2[6] = (ulong)bVar11 * auVar21._48_8_ | (ulong)!bVar11 * puVar2[6];
            puVar2[7] = (uVar12 >> 7) * auVar21._56_8_ | (ulong)!SUB81(uVar12 >> 7,0) * puVar2[7];
            uVar16 = uVar16 + 8;
          } while ((lVar15 + (ulong)(lVar15 == 0) + 7 & 0xfffffffffffffff8) != uVar16);
        }
        uVar18 = uVar18 + 1;
        iVar13 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])
                           (this);
        lVar17 = CONCAT44(extraout_var_00,iVar13);
        auVar19 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      } while (uVar18 < (ulong)(*(long *)(lVar17 + 0x118) - *(long *)(lVar17 + 0x110) >> 4));
    }
    return (int)lVar17;
  }
  this_00 = (Exception *)__cxa_allocate_exception(0x10);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"hak.cpp, line 187","");
  Exception::Exception(this_00,8,&local_40);
  __cxa_throw(this_00,&Exception::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void HAK::init() {
        if( !initProps() )
            DAI_THROW(NOT_ALL_PROPERTIES_SPECIFIED);

        for( vector<Factor>::iterator alpha = _Qa.begin(); alpha != _Qa.end(); alpha++ )
            alpha->fill( 1.0 / alpha->stateSpace() );

        for( vector<Factor>::iterator beta = _Qb.begin(); beta != _Qb.end(); beta++ )
            beta->fill( 1.0 / beta->stateSpace() );

        for( size_t ab = 0; ab < grm().nr_Redges(); ab++ ) {
            _muab[ab].fill( 1.0 / _muab[ab].stateSpace() );
            _muba[ab].fill( 1.0 / _muba[ab].stateSpace() );
        }
    }